

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_disk_secure.c
# Opt level: O0

void test_write_disk_secure(void)

{
  bool bVar1;
  int iVar2;
  archive *a_00;
  archive_entry *paVar3;
  int *piVar4;
  undefined1 local_a8 [4];
  int working_lchmod;
  stat_conflict st;
  archive_entry *ae;
  archive *a;
  
  assertion_umask("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                  ,L'0',L'\x12');
  a_00 = archive_write_disk_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'3',(uint)(a_00 != (archive *)0x0),"(a = archive_write_disk_new()) != NULL",
                   (void *)0x0);
  st.__glibc_reserved[2] = (__syscall_slong_t)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'6',(uint)((archive_entry *)st.__glibc_reserved[2] != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname((archive_entry *)st.__glibc_reserved[2],"dir");
  archive_entry_set_mode((archive_entry *)st.__glibc_reserved[2],0x41ff);
  iVar2 = archive_write_header(a_00,(archive_entry *)st.__glibc_reserved[2]);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'9',(uint)(iVar2 == 0),"0 == archive_write_header(a, ae)",(void *)0x0);
  archive_entry_free((archive_entry *)st.__glibc_reserved[2]);
  iVar2 = archive_write_finish_entry(a_00);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L';',(uint)(iVar2 == 0),"0 == archive_write_finish_entry(a)",(void *)0x0);
  st.__glibc_reserved[2] = (__syscall_slong_t)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'>',(uint)((archive_entry *)st.__glibc_reserved[2] != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname((archive_entry *)st.__glibc_reserved[2],"link_to_dir");
  archive_entry_set_mode((archive_entry *)st.__glibc_reserved[2],0xa1ff);
  archive_entry_set_symlink((archive_entry *)st.__glibc_reserved[2],"dir");
  archive_write_disk_set_options(a_00,L'\0');
  iVar2 = archive_write_header(a_00,(archive_entry *)st.__glibc_reserved[2]);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'C',(uint)(iVar2 == 0),"0 == archive_write_header(a, ae)",(void *)0x0);
  iVar2 = archive_write_finish_entry(a_00);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'D',(uint)(iVar2 == 0),"0 == archive_write_finish_entry(a)",(void *)0x0);
  paVar3 = archive_entry_clear((archive_entry *)st.__glibc_reserved[2]);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'J',(uint)(paVar3 != (archive_entry *)0x0),"archive_entry_clear(ae) != NULL",
                   (void *)0x0);
  archive_entry_copy_pathname((archive_entry *)st.__glibc_reserved[2],"link_to_dir/filea");
  archive_entry_set_mode((archive_entry *)st.__glibc_reserved[2],0x81ff);
  iVar2 = archive_write_header(a_00,(archive_entry *)st.__glibc_reserved[2]);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'M',(uint)(iVar2 == 0),"0 == archive_write_header(a, ae)",(void *)0x0);
  iVar2 = archive_write_finish_entry(a_00);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'N',(uint)(iVar2 == 0),"0 == archive_write_finish_entry(a)",(void *)0x0);
  paVar3 = archive_entry_clear((archive_entry *)st.__glibc_reserved[2]);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'Q',(uint)(paVar3 != (archive_entry *)0x0),"archive_entry_clear(ae) != NULL",
                   (void *)0x0);
  archive_entry_copy_pathname((archive_entry *)st.__glibc_reserved[2],"link_to_dir/fileb");
  archive_entry_set_mode((archive_entry *)st.__glibc_reserved[2],0x81ff);
  archive_write_disk_set_options(a_00,L'Ā');
  failure("Extracting a file through a symlink should fail here.");
  iVar2 = archive_write_header(a_00,(archive_entry *)st.__glibc_reserved[2]);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                      ,L'V',-0x19,"ARCHIVE_FAILED",(long)iVar2,"archive_write_header(a, ae)",
                      (void *)0x0);
  archive_entry_free((archive_entry *)st.__glibc_reserved[2]);
  iVar2 = archive_write_finish_entry(a_00);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'X',(uint)(iVar2 == 0),"0 == archive_write_finish_entry(a)",(void *)0x0);
  st.__glibc_reserved[2] = (__syscall_slong_t)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'[',(uint)((archive_entry *)st.__glibc_reserved[2] != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname
            ((archive_entry *)st.__glibc_reserved[2],
             "/tmp/libarchive_test-test_write_disk_secure-absolute_symlink");
  archive_entry_set_mode((archive_entry *)st.__glibc_reserved[2],0xa1ff);
  archive_entry_set_symlink((archive_entry *)st.__glibc_reserved[2],"/tmp");
  archive_write_disk_set_options(a_00,L'\0');
  iVar2 = archive_write_header(a_00,(archive_entry *)st.__glibc_reserved[2]);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'`',(uint)(iVar2 == 0),"0 == archive_write_header(a, ae)",(void *)0x0);
  iVar2 = archive_write_finish_entry(a_00);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'a',(uint)(iVar2 == 0),"0 == archive_write_finish_entry(a)",(void *)0x0);
  paVar3 = archive_entry_clear((archive_entry *)st.__glibc_reserved[2]);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'd',(uint)(paVar3 != (archive_entry *)0x0),"archive_entry_clear(ae) != NULL",
                   (void *)0x0);
  archive_entry_copy_pathname
            ((archive_entry *)st.__glibc_reserved[2],
             "/tmp/libarchive_test-test_write_disk_secure-absolute_symlink/libarchive_test-test_write_disk_secure-absolute_symlink_path.tmp"
            );
  archive_entry_set_mode((archive_entry *)st.__glibc_reserved[2],0x81ff);
  archive_write_disk_set_options(a_00,L'Ā');
  failure("Extracting a file through an absolute symlink should fail here.");
  iVar2 = archive_write_header(a_00,(archive_entry *)st.__glibc_reserved[2]);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                      ,L'i',-0x19,"ARCHIVE_FAILED",(long)iVar2,"archive_write_header(a, ae)",
                      (void *)0x0);
  archive_entry_free((archive_entry *)st.__glibc_reserved[2]);
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
             ,L'k',
             "/tmp/libarchive_test-test_write_disk_secure-absolute_symlink/libarchive_test-test_write_disk_secure-absolute_symlink_path.tmp"
            );
  iVar2 = unlink("/tmp/libarchive_test-test_write_disk_secure-absolute_symlink");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'l',(uint)(iVar2 == 0),
                   "0 == unlink(\"/tmp/libarchive_test-test_write_disk_secure-absolute_symlink\")",
                   (void *)0x0);
  unlink("/tmp/libarchive_test-test_write_disk_secure-absolute_symlink_path.tmp");
  st.__glibc_reserved[2] = (__syscall_slong_t)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'p',(uint)((archive_entry *)st.__glibc_reserved[2] != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname((archive_entry *)st.__glibc_reserved[2],"link_to_dir2");
  archive_entry_set_mode((archive_entry *)st.__glibc_reserved[2],0xa1ff);
  archive_entry_set_symlink((archive_entry *)st.__glibc_reserved[2],"dir");
  archive_write_disk_set_options(a_00,L'\0');
  iVar2 = archive_write_header(a_00,(archive_entry *)st.__glibc_reserved[2]);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'u',(uint)(iVar2 == 0),"0 == archive_write_header(a, ae)",(void *)0x0);
  iVar2 = archive_write_finish_entry(a_00);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'v',(uint)(iVar2 == 0),"0 == archive_write_finish_entry(a)",(void *)0x0);
  paVar3 = archive_entry_clear((archive_entry *)st.__glibc_reserved[2]);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'|',(uint)(paVar3 != (archive_entry *)0x0),"archive_entry_clear(ae) != NULL",
                   (void *)0x0);
  archive_entry_copy_pathname((archive_entry *)st.__glibc_reserved[2],"link_to_dir2/filec");
  archive_entry_set_mode((archive_entry *)st.__glibc_reserved[2],0x81ff);
  archive_write_disk_set_options(a_00,L'Đ');
  iVar2 = archive_write_header(a_00,(archive_entry *)st.__glibc_reserved[2]);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                      ,L'\x80',0,"ARCHIVE_OK",(long)iVar2,"archive_write_header(a, ae)",a_00);
  archive_entry_free((archive_entry *)st.__glibc_reserved[2]);
  iVar2 = archive_write_finish_entry(a_00);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'\x82',(uint)(iVar2 == 0),"0 == archive_write_finish_entry(a)",(void *)0x0);
  st.__glibc_reserved[2] = (__syscall_slong_t)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'\x85',(uint)((archive_entry *)st.__glibc_reserved[2] != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname((archive_entry *)st.__glibc_reserved[2],"dir/nested_link_to_dir");
  archive_entry_set_mode((archive_entry *)st.__glibc_reserved[2],0xa1ff);
  archive_entry_set_symlink((archive_entry *)st.__glibc_reserved[2],"../dir");
  archive_write_disk_set_options(a_00,L'\0');
  iVar2 = archive_write_header(a_00,(archive_entry *)st.__glibc_reserved[2]);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'\x8a',(uint)(iVar2 == 0),"0 == archive_write_header(a, ae)",(void *)0x0);
  iVar2 = archive_write_finish_entry(a_00);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'\x8b',(uint)(iVar2 == 0),"0 == archive_write_finish_entry(a)",(void *)0x0);
  paVar3 = archive_entry_clear((archive_entry *)st.__glibc_reserved[2]);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'\x8e',(uint)(paVar3 != (archive_entry *)0x0),"archive_entry_clear(ae) != NULL"
                   ,(void *)0x0);
  archive_entry_copy_pathname
            ((archive_entry *)st.__glibc_reserved[2],"dir/nested_link_to_dir/filed");
  archive_entry_set_mode((archive_entry *)st.__glibc_reserved[2],0x81ff);
  archive_write_disk_set_options(a_00,L'Ā');
  failure("Extracting a file through a symlink should fail here.");
  iVar2 = archive_write_header(a_00,(archive_entry *)st.__glibc_reserved[2]);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                      ,L'\x93',-0x19,"ARCHIVE_FAILED",(long)iVar2,"archive_write_header(a, ae)",
                      (void *)0x0);
  archive_entry_free((archive_entry *)st.__glibc_reserved[2]);
  iVar2 = archive_write_finish_entry(a_00);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'\x95',(uint)(iVar2 == 0),"0 == archive_write_finish_entry(a)",(void *)0x0);
  st.__glibc_reserved[2] = (__syscall_slong_t)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'\x9c',(uint)((archive_entry *)st.__glibc_reserved[2] != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname((archive_entry *)st.__glibc_reserved[2],"link_to_dir3");
  archive_entry_set_mode((archive_entry *)st.__glibc_reserved[2],0xa1ff);
  archive_entry_set_symlink((archive_entry *)st.__glibc_reserved[2],"dir");
  archive_write_disk_set_options(a_00,L'\0');
  iVar2 = archive_write_header(a_00,(archive_entry *)st.__glibc_reserved[2]);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'¡',(uint)(iVar2 == 0),"0 == archive_write_header(a, ae)",(void *)0x0);
  iVar2 = archive_write_finish_entry(a_00);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'¢',(uint)(iVar2 == 0),"0 == archive_write_finish_entry(a)",(void *)0x0);
  paVar3 = archive_entry_clear((archive_entry *)st.__glibc_reserved[2]);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'¤',(uint)(paVar3 != (archive_entry *)0x0),"archive_entry_clear(ae) != NULL",
                   (void *)0x0);
  archive_entry_copy_pathname((archive_entry *)st.__glibc_reserved[2],"link_to_dir3");
  archive_entry_set_mode((archive_entry *)st.__glibc_reserved[2],0x41ff);
  iVar2 = archive_write_header(a_00,(archive_entry *)st.__glibc_reserved[2]);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'§',(uint)(iVar2 == 0),"0 == archive_write_header(a, ae)",(void *)0x0);
  iVar2 = archive_write_finish_entry(a_00);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'¨',(uint)(iVar2 == 0),"0 == archive_write_finish_entry(a)",(void *)0x0);
  iVar2 = lstat("link_to_dir3",(stat *)local_a8);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                      ,L'ª',0,"0",(long)iVar2,"lstat(\"link_to_dir3\", &st)",(void *)0x0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'«',(uint)(((uint)st.st_nlink & 0xf000) == 0xa000),"S_ISLNK(st.st_mode)",
                   (void *)0x0);
  archive_entry_free((archive_entry *)st.__glibc_reserved[2]);
  st.__glibc_reserved[2] = (__syscall_slong_t)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'²',(uint)((archive_entry *)st.__glibc_reserved[2] != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname((archive_entry *)st.__glibc_reserved[2],"link_to_dir4");
  archive_entry_set_mode((archive_entry *)st.__glibc_reserved[2],0xa1ff);
  archive_entry_set_symlink((archive_entry *)st.__glibc_reserved[2],"nonexistent_dir");
  archive_write_disk_set_options(a_00,L'\0');
  iVar2 = archive_write_header(a_00,(archive_entry *)st.__glibc_reserved[2]);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'·',(uint)(iVar2 == 0),"0 == archive_write_header(a, ae)",(void *)0x0);
  iVar2 = archive_write_finish_entry(a_00);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'¸',(uint)(iVar2 == 0),"0 == archive_write_finish_entry(a)",(void *)0x0);
  paVar3 = archive_entry_clear((archive_entry *)st.__glibc_reserved[2]);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'º',(uint)(paVar3 != (archive_entry *)0x0),"archive_entry_clear(ae) != NULL",
                   (void *)0x0);
  archive_entry_copy_pathname((archive_entry *)st.__glibc_reserved[2],"link_to_dir4");
  archive_entry_set_mode((archive_entry *)st.__glibc_reserved[2],0x41ff);
  iVar2 = archive_write_header(a_00,(archive_entry *)st.__glibc_reserved[2]);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'½',(uint)(iVar2 == 0),"0 == archive_write_header(a, ae)",(void *)0x0);
  iVar2 = archive_write_finish_entry(a_00);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'¾',(uint)(iVar2 == 0),"0 == archive_write_finish_entry(a)",(void *)0x0);
  iVar2 = lstat("link_to_dir4",(stat *)local_a8);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                      ,L'À',0,"0",(long)iVar2,"lstat(\"link_to_dir4\", &st)",(void *)0x0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'Á',(uint)(((uint)st.st_nlink & 0xf000) == 0x4000),"S_ISDIR(st.st_mode)",
                   (void *)0x0);
  archive_entry_free((archive_entry *)st.__glibc_reserved[2]);
  st.__glibc_reserved[2] = (__syscall_slong_t)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'È',(uint)((archive_entry *)st.__glibc_reserved[2] != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname((archive_entry *)st.__glibc_reserved[2],"non_dir");
  archive_entry_set_mode((archive_entry *)st.__glibc_reserved[2],0x81ff);
  archive_write_disk_set_options(a_00,L'\0');
  iVar2 = archive_write_header(a_00,(archive_entry *)st.__glibc_reserved[2]);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'Ì',(uint)(iVar2 == 0),"0 == archive_write_header(a, ae)",(void *)0x0);
  iVar2 = archive_write_finish_entry(a_00);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'Í',(uint)(iVar2 == 0),"0 == archive_write_finish_entry(a)",(void *)0x0);
  archive_entry_copy_pathname((archive_entry *)st.__glibc_reserved[2],"link_to_dir5");
  archive_entry_set_mode((archive_entry *)st.__glibc_reserved[2],0xa1ff);
  archive_entry_set_symlink((archive_entry *)st.__glibc_reserved[2],"non_dir");
  archive_write_disk_set_options(a_00,L'\0');
  iVar2 = archive_write_header(a_00,(archive_entry *)st.__glibc_reserved[2]);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'Ó',(uint)(iVar2 == 0),"0 == archive_write_header(a, ae)",(void *)0x0);
  iVar2 = archive_write_finish_entry(a_00);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'Ô',(uint)(iVar2 == 0),"0 == archive_write_finish_entry(a)",(void *)0x0);
  paVar3 = archive_entry_clear((archive_entry *)st.__glibc_reserved[2]);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'Ö',(uint)(paVar3 != (archive_entry *)0x0),"archive_entry_clear(ae) != NULL",
                   (void *)0x0);
  archive_entry_copy_pathname((archive_entry *)st.__glibc_reserved[2],"link_to_dir5");
  archive_entry_set_mode((archive_entry *)st.__glibc_reserved[2],0x41ff);
  iVar2 = archive_write_header(a_00,(archive_entry *)st.__glibc_reserved[2]);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'Ù',(uint)(iVar2 == 0),"0 == archive_write_header(a, ae)",(void *)0x0);
  iVar2 = archive_write_finish_entry(a_00);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'Ú',(uint)(iVar2 == 0),"0 == archive_write_finish_entry(a)",(void *)0x0);
  iVar2 = lstat("link_to_dir5",(stat *)local_a8);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                      ,L'Ü',0,"0",(long)iVar2,"lstat(\"link_to_dir5\", &st)",(void *)0x0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'Ý',(uint)(((uint)st.st_nlink & 0xf000) == 0x4000),"S_ISDIR(st.st_mode)",
                   (void *)0x0);
  archive_entry_free((archive_entry *)st.__glibc_reserved[2]);
  st.__glibc_reserved[2] = (__syscall_slong_t)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'ä',(uint)((archive_entry *)st.__glibc_reserved[2] != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname
            ((archive_entry *)st.__glibc_reserved[2],
             "/tmp/libarchive_test-test_write_disk_secure-absolute_path.tmp");
  archive_entry_set_mode((archive_entry *)st.__glibc_reserved[2],0x81ff);
  iVar2 = archive_write_header(a_00,(archive_entry *)st.__glibc_reserved[2]);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'ç',(uint)(iVar2 == 0),"0 == archive_write_header(a, ae)",(void *)0x0);
  iVar2 = archive_write_finish_entry(a_00);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'è',(uint)(iVar2 == 0),"0 == archive_write_finish_entry(a)",(void *)0x0);
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
             ,L'é',"/tmp/libarchive_test-test_write_disk_secure-absolute_path.tmp");
  iVar2 = unlink("/tmp/libarchive_test-test_write_disk_secure-absolute_path.tmp");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'ê',(uint)(iVar2 == 0),
                   "0 == unlink(\"/tmp/libarchive_test-test_write_disk_secure-absolute_path.tmp\")",
                   (void *)0x0);
  paVar3 = archive_entry_clear((archive_entry *)st.__glibc_reserved[2]);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'í',(uint)(paVar3 != (archive_entry *)0x0),"archive_entry_clear(ae) != NULL",
                   (void *)0x0);
  archive_entry_copy_pathname
            ((archive_entry *)st.__glibc_reserved[2],
             "/tmp/libarchive_test-test_write_disk_secure-absolute_path.tmp");
  archive_entry_set_mode((archive_entry *)st.__glibc_reserved[2],0x81ff);
  archive_write_disk_set_options(a_00,L'𐀀');
  failure("Extracting an absolute path should fail here.");
  iVar2 = archive_write_header(a_00,(archive_entry *)st.__glibc_reserved[2]);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                      ,L'ò',-0x19,"ARCHIVE_FAILED",(long)iVar2,"archive_write_header(a, ae)",
                      (void *)0x0);
  archive_entry_free((archive_entry *)st.__glibc_reserved[2]);
  iVar2 = archive_write_finish_entry(a_00);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'ô',(uint)(iVar2 == 0),"0 == archive_write_finish_entry(a)",(void *)0x0);
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
             ,L'õ',"/tmp/libarchive_test-test_write_disk_secure-absolute_path.tmp");
  iVar2 = archive_write_free(a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                      ,L'÷',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
  iVar2 = lstat("dir",(stat *)local_a8);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'ú',(uint)(iVar2 == 0),"0 == lstat(\"dir\", &st)",(void *)0x0);
  failure("dir: st.st_mode=%o",(ulong)(uint)st.st_nlink);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'ü',(uint)(((uint)st.st_nlink & 0x1ff) == 0x1ed),"(st.st_mode & 0777) == 0755"
                   ,(void *)0x0);
  iVar2 = lstat("link_to_dir",(stat *)local_a8);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'þ',(uint)(iVar2 == 0),"0 == lstat(\"link_to_dir\", &st)",(void *)0x0);
  failure("link_to_dir: st.st_mode=%o",(ulong)(uint)st.st_nlink);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'Ā',(uint)(((uint)st.st_nlink & 0xf000) == 0xa000),"S_ISLNK(st.st_mode)",
                   (void *)0x0);
  iVar2 = symlink("dir","testlink_to_dir");
  if (iVar2 == 0) {
    iVar2 = lchmod("testlink_to_dir",0x1c0);
    if (iVar2 == 0) {
      bVar1 = true;
    }
    else {
      piVar4 = __errno_location();
      if ((*piVar4 == 0x26) || (*piVar4 == 0x5f)) {
        bVar1 = false;
      }
      else {
        bVar1 = true;
      }
    }
  }
  else {
    bVar1 = false;
  }
  if (bVar1) {
    failure("link_to_dir: st.st_mode=%o",(ulong)(uint)st.st_nlink);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                     ,L'ę',(uint)(((uint)st.st_nlink & 0xfff) == 0x1ed),
                     "(st.st_mode & 07777) == 0755",(void *)0x0);
  }
  iVar2 = lstat("dir/filea",(stat *)local_a8);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'ĝ',(uint)(iVar2 == 0),"0 == lstat(\"dir/filea\", &st)",(void *)0x0);
  failure("dir/filea: st.st_mode=%o",(ulong)(uint)st.st_nlink);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'ğ',(uint)(((uint)st.st_nlink & 0xfff) == 0x1ed),
                   "(st.st_mode & 07777) == 0755",(void *)0x0);
  failure("dir/fileb: This file should not have been created");
  iVar2 = lstat("dir/fileb",(stat *)local_a8);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'Ģ',(uint)(iVar2 != 0),"0 != lstat(\"dir/fileb\", &st)",(void *)0x0);
  iVar2 = lstat("link_to_dir2",(stat *)local_a8);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'Ĥ',(uint)(iVar2 == 0),"0 == lstat(\"link_to_dir2\", &st)",(void *)0x0);
  failure("link_to_dir2 should have been re-created as a true dir");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'Ħ',(uint)(((uint)st.st_nlink & 0xf000) == 0x4000),"S_ISDIR(st.st_mode)",
                   (void *)0x0);
  failure("link_to_dir2: Implicit dir creation should obey umask, but st.st_mode=%o",
          (ulong)(uint)st.st_nlink);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'Ĩ',(uint)(((uint)st.st_nlink & 0x1ff) == 0x1ed),"(st.st_mode & 0777) == 0755"
                   ,(void *)0x0);
  iVar2 = lstat("link_to_dir2/filec",(stat *)local_a8);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'Ī',(uint)(iVar2 == 0),"0 == lstat(\"link_to_dir2/filec\", &st)",(void *)0x0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'ī',(uint)(((uint)st.st_nlink & 0xf000) == 0x8000),"S_ISREG(st.st_mode)",
                   (void *)0x0);
  failure("link_to_dir2/filec: st.st_mode=%o",(ulong)(uint)st.st_nlink);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'ĭ',(uint)(((uint)st.st_nlink & 0xfff) == 0x1ed),
                   "(st.st_mode & 07777) == 0755",(void *)0x0);
  failure("dir/filed: This file should not have been created");
  iVar2 = lstat("dir/filed",(stat *)local_a8);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure.c"
                   ,L'İ',(uint)(iVar2 != 0),"0 != lstat(\"dir/filed\", &st)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_write_disk_secure)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	skipping("archive_write_disk security checks not supported on Windows");
#else
	struct archive *a;
	struct archive_entry *ae;
	struct stat st;
#if defined(HAVE_LCHMOD) && defined(HAVE_SYMLINK) && \
    defined(S_IRUSR) && defined(S_IWUSR) && defined(S_IXUSR)
	int working_lchmod;
#endif

	/* Start with a known umask. */
	assertUmask(UMASK);

	/* Create an archive_write_disk object. */
	assert((a = archive_write_disk_new()) != NULL);

	/* Write a regular dir to it. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "dir");
	archive_entry_set_mode(ae, S_IFDIR | 0777);
	assert(0 == archive_write_header(a, ae));
	archive_entry_free(ae);
	assert(0 == archive_write_finish_entry(a));

	/* Write a symlink to the dir above. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "link_to_dir");
	archive_entry_set_mode(ae, S_IFLNK | 0777);
	archive_entry_set_symlink(ae, "dir");
	archive_write_disk_set_options(a, 0);
	assert(0 == archive_write_header(a, ae));
	assert(0 == archive_write_finish_entry(a));

	/*
	 * Without security checks, we should be able to
	 * extract a file through the link.
	 */
	assert(archive_entry_clear(ae) != NULL);
	archive_entry_copy_pathname(ae, "link_to_dir/filea");
	archive_entry_set_mode(ae, S_IFREG | 0777);
	assert(0 == archive_write_header(a, ae));
	assert(0 == archive_write_finish_entry(a));

	/* But with security checks enabled, this should fail. */
	assert(archive_entry_clear(ae) != NULL);
	archive_entry_copy_pathname(ae, "link_to_dir/fileb");
	archive_entry_set_mode(ae, S_IFREG | 0777);
	archive_write_disk_set_options(a, ARCHIVE_EXTRACT_SECURE_SYMLINKS);
	failure("Extracting a file through a symlink should fail here.");
	assertEqualInt(ARCHIVE_FAILED, archive_write_header(a, ae));
	archive_entry_free(ae);
	assert(0 == archive_write_finish_entry(a));

	/* Write an absolute symlink to /tmp. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "/tmp/libarchive_test-test_write_disk_secure-absolute_symlink");
	archive_entry_set_mode(ae, S_IFLNK | 0777);
	archive_entry_set_symlink(ae, "/tmp");
	archive_write_disk_set_options(a, 0);
	assert(0 == archive_write_header(a, ae));
	assert(0 == archive_write_finish_entry(a));

	/* With security checks enabled, this should fail. */
	assert(archive_entry_clear(ae) != NULL);
	archive_entry_copy_pathname(ae, "/tmp/libarchive_test-test_write_disk_secure-absolute_symlink/libarchive_test-test_write_disk_secure-absolute_symlink_path.tmp");
	archive_entry_set_mode(ae, S_IFREG | 0777);
	archive_write_disk_set_options(a, ARCHIVE_EXTRACT_SECURE_SYMLINKS);
	failure("Extracting a file through an absolute symlink should fail here.");
	assertEqualInt(ARCHIVE_FAILED, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertFileNotExists("/tmp/libarchive_test-test_write_disk_secure-absolute_symlink/libarchive_test-test_write_disk_secure-absolute_symlink_path.tmp");
	assert(0 == unlink("/tmp/libarchive_test-test_write_disk_secure-absolute_symlink"));
	unlink("/tmp/libarchive_test-test_write_disk_secure-absolute_symlink_path.tmp");

	/* Create another link. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "link_to_dir2");
	archive_entry_set_mode(ae, S_IFLNK | 0777);
	archive_entry_set_symlink(ae, "dir");
	archive_write_disk_set_options(a, 0);
	assert(0 == archive_write_header(a, ae));
	assert(0 == archive_write_finish_entry(a));

	/*
	 * With symlink check and unlink option, it should remove
	 * the link and create the dir.
	 */
	assert(archive_entry_clear(ae) != NULL);
	archive_entry_copy_pathname(ae, "link_to_dir2/filec");
	archive_entry_set_mode(ae, S_IFREG | 0777);
	archive_write_disk_set_options(a, ARCHIVE_EXTRACT_SECURE_SYMLINKS | ARCHIVE_EXTRACT_UNLINK);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assert(0 == archive_write_finish_entry(a));

	/* Create a nested symlink. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "dir/nested_link_to_dir");
	archive_entry_set_mode(ae, S_IFLNK | 0777);
	archive_entry_set_symlink(ae, "../dir");
	archive_write_disk_set_options(a, 0);
	assert(0 == archive_write_header(a, ae));
	assert(0 == archive_write_finish_entry(a));

	/* But with security checks enabled, this should fail. */
	assert(archive_entry_clear(ae) != NULL);
	archive_entry_copy_pathname(ae, "dir/nested_link_to_dir/filed");
	archive_entry_set_mode(ae, S_IFREG | 0777);
	archive_write_disk_set_options(a, ARCHIVE_EXTRACT_SECURE_SYMLINKS);
	failure("Extracting a file through a symlink should fail here.");
	assertEqualInt(ARCHIVE_FAILED, archive_write_header(a, ae));
	archive_entry_free(ae);
	assert(0 == archive_write_finish_entry(a));

	/*
	 * Without security checks, extracting a dir over a link to a
	 * dir should follow the link.
	 */
	/* Create a symlink to a dir. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "link_to_dir3");
	archive_entry_set_mode(ae, S_IFLNK | 0777);
	archive_entry_set_symlink(ae, "dir");
	archive_write_disk_set_options(a, 0);
	assert(0 == archive_write_header(a, ae));
	assert(0 == archive_write_finish_entry(a));
	/* Extract a dir whose name matches the symlink. */
	assert(archive_entry_clear(ae) != NULL);
	archive_entry_copy_pathname(ae, "link_to_dir3");
	archive_entry_set_mode(ae, S_IFDIR | 0777);
	assert(0 == archive_write_header(a, ae));
	assert(0 == archive_write_finish_entry(a));
	/* Verify link was followed. */
	assertEqualInt(0, lstat("link_to_dir3", &st));
	assert(S_ISLNK(st.st_mode));
	archive_entry_free(ae);

	/*
	 * As above, but a broken link, so the link should get replaced.
	 */
	/* Create a symlink to a dir. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "link_to_dir4");
	archive_entry_set_mode(ae, S_IFLNK | 0777);
	archive_entry_set_symlink(ae, "nonexistent_dir");
	archive_write_disk_set_options(a, 0);
	assert(0 == archive_write_header(a, ae));
	assert(0 == archive_write_finish_entry(a));
	/* Extract a dir whose name matches the symlink. */
	assert(archive_entry_clear(ae) != NULL);
	archive_entry_copy_pathname(ae, "link_to_dir4");
	archive_entry_set_mode(ae, S_IFDIR | 0777);
	assert(0 == archive_write_header(a, ae));
	assert(0 == archive_write_finish_entry(a));
	/* Verify link was replaced. */
	assertEqualInt(0, lstat("link_to_dir4", &st));
	assert(S_ISDIR(st.st_mode));
	archive_entry_free(ae);

	/*
	 * As above, but a link to a non-dir, so the link should get replaced.
	 */
	/* Create a regular file and a symlink to it */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "non_dir");
	archive_entry_set_mode(ae, S_IFREG | 0777);
	archive_write_disk_set_options(a, 0);
	assert(0 == archive_write_header(a, ae));
	assert(0 == archive_write_finish_entry(a));
	/* Create symlink to the file. */
	archive_entry_copy_pathname(ae, "link_to_dir5");
	archive_entry_set_mode(ae, S_IFLNK | 0777);
	archive_entry_set_symlink(ae, "non_dir");
	archive_write_disk_set_options(a, 0);
	assert(0 == archive_write_header(a, ae));
	assert(0 == archive_write_finish_entry(a));
	/* Extract a dir whose name matches the symlink. */
	assert(archive_entry_clear(ae) != NULL);
	archive_entry_copy_pathname(ae, "link_to_dir5");
	archive_entry_set_mode(ae, S_IFDIR | 0777);
	assert(0 == archive_write_header(a, ae));
	assert(0 == archive_write_finish_entry(a));
	/* Verify link was replaced. */
	assertEqualInt(0, lstat("link_to_dir5", &st));
	assert(S_ISDIR(st.st_mode));
	archive_entry_free(ae);

	/*
	 * Without security checks, we should be able to
	 * extract an absolute path.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "/tmp/libarchive_test-test_write_disk_secure-absolute_path.tmp");
	archive_entry_set_mode(ae, S_IFREG | 0777);
	assert(0 == archive_write_header(a, ae));
	assert(0 == archive_write_finish_entry(a));
	assertFileExists("/tmp/libarchive_test-test_write_disk_secure-absolute_path.tmp");
	assert(0 == unlink("/tmp/libarchive_test-test_write_disk_secure-absolute_path.tmp"));

	/* But with security checks enabled, this should fail. */
	assert(archive_entry_clear(ae) != NULL);
	archive_entry_copy_pathname(ae, "/tmp/libarchive_test-test_write_disk_secure-absolute_path.tmp");
	archive_entry_set_mode(ae, S_IFREG | 0777);
	archive_write_disk_set_options(a, ARCHIVE_EXTRACT_SECURE_NOABSOLUTEPATHS);
	failure("Extracting an absolute path should fail here.");
	assertEqualInt(ARCHIVE_FAILED, archive_write_header(a, ae));
	archive_entry_free(ae);
	assert(0 == archive_write_finish_entry(a));
	assertFileNotExists("/tmp/libarchive_test-test_write_disk_secure-absolute_path.tmp");

	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Test the entries on disk. */
	assert(0 == lstat("dir", &st));
	failure("dir: st.st_mode=%o", st.st_mode);
	assert((st.st_mode & 0777) == 0755);

	assert(0 == lstat("link_to_dir", &st));
	failure("link_to_dir: st.st_mode=%o", st.st_mode);
	assert(S_ISLNK(st.st_mode));
#if defined(HAVE_SYMLINK) && defined(HAVE_LCHMOD) && \
    defined(S_IRUSR) && defined(S_IWUSR) && defined(S_IXUSR)
	/* Verify if we are able to lchmod() */
	if (symlink("dir", "testlink_to_dir") == 0) {
		if (lchmod("testlink_to_dir",
		    S_IRUSR | S_IWUSR | S_IXUSR) != 0) {
			switch (errno) {
				case ENOTSUP:
				case ENOSYS:
#if ENOTSUP != EOPNOTSUPP
				case EOPNOTSUPP:
#endif
					working_lchmod = 0;
					break;
				default:
					working_lchmod = 1;
			}
		} else
			working_lchmod = 1;
	} else
		working_lchmod = 0;

	if (working_lchmod) {
		failure("link_to_dir: st.st_mode=%o", st.st_mode);
		assert((st.st_mode & 07777) == 0755);
	}
#endif

	assert(0 == lstat("dir/filea", &st));
	failure("dir/filea: st.st_mode=%o", st.st_mode);
	assert((st.st_mode & 07777) == 0755);

	failure("dir/fileb: This file should not have been created");
	assert(0 != lstat("dir/fileb", &st));

	assert(0 == lstat("link_to_dir2", &st));
	failure("link_to_dir2 should have been re-created as a true dir");
	assert(S_ISDIR(st.st_mode));
	failure("link_to_dir2: Implicit dir creation should obey umask, but st.st_mode=%o", st.st_mode);
	assert((st.st_mode & 0777) == 0755);

	assert(0 == lstat("link_to_dir2/filec", &st));
	assert(S_ISREG(st.st_mode));
	failure("link_to_dir2/filec: st.st_mode=%o", st.st_mode);
	assert((st.st_mode & 07777) == 0755);

	failure("dir/filed: This file should not have been created");
	assert(0 != lstat("dir/filed", &st));
#endif
}